

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O3

int max_mon_load(monst *mtmp)

{
  ushort uVar1;
  permonst *ppVar2;
  ulong uVar3;
  uint uVar4;
  
  ppVar2 = mtmp->data;
  uVar1 = ppVar2->cwt;
  if (uVar1 == 0) {
    uVar3 = (ulong)ppVar2->msize * 500;
    uVar4 = ppVar2->mflags2 & 0x4000000;
  }
  else {
    uVar4 = ppVar2->mflags2 & 0x4000000;
    uVar3 = 1000;
    if ((uVar1 < 0x5ab & (byte)(uVar4 >> 0x1a)) == 0) {
      uVar3 = (ulong)((uint)uVar1 * 1000) / 0x5aa;
    }
  }
  uVar3 = uVar3 >> (uVar4 == 0);
  return (int)uVar3 + (uint)(uVar3 == 0);
}

Assistant:

int max_mon_load(struct monst *mtmp)
{
	long maxload;

	/* Base monster carrying capacity is equal to human maximum
	 * carrying capacity, or half human maximum if not strong.
	 * (for a polymorphed player, the value used would be the
	 * non-polymorphed carrying capacity instead of max/half max).
	 * This is then modified by the ratio between the monster weights
	 * and human weights.  Corpseless monsters are given a capacity
	 * proportional to their size instead of weight.
	 */
	if (!mtmp->data->cwt)
		maxload = (MAX_CARR_CAP * (long)mtmp->data->msize) / MZ_HUMAN;
	else if (!strongmonst(mtmp->data)
		|| (strongmonst(mtmp->data) && (mtmp->data->cwt > WT_HUMAN)))
		maxload = (MAX_CARR_CAP * (long)mtmp->data->cwt) / WT_HUMAN;
	else	maxload = MAX_CARR_CAP; /*strong monsters w/cwt <= WT_HUMAN*/

	if (!strongmonst(mtmp->data)) maxload /= 2;

	if (maxload < 1) maxload = 1;

	return (int) maxload;
}